

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.hpp
# Opt level: O1

void parse<std::deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,cpp_properties::properties_actor_traits<std::deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__cxx11::string,cpp_properties::emplace_front_adapter_policy>>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,
               deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *cpp_properties)

{
  bool bVar1;
  ostream *poVar2;
  size_type *local_40;
  string rest;
  
  bVar1 = ::cpp_properties::
          parse<std::deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,cpp_properties::properties_actor_traits<std::deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__cxx11::string,cpp_properties::emplace_front_adapter_policy>,cpp_properties::properties_actor<cpp_properties::properties_actor_traits<std::deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__cxx11::string,cpp_properties::emplace_front_adapter_policy>>,cpp_properties::properties_action<cpp_properties::properties_actor<cpp_properties::properties_actor_traits<std::deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__cxx11::string,cpp_properties::emplace_front_adapter_policy>>>>
                    (first,last,cpp_properties);
  if (!bVar1) {
    local_40 = &rest._M_string_length;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_40,first._M_current,last._M_current);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Lexical analysis failed\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stopped at: \"",0xd);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_40,(long)rest._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
    if (local_40 != &rest._M_string_length) {
      operator_delete(local_40,rest._M_string_length + 1);
    }
  }
  return;
}

Assistant:

void parse(Iterator first, Iterator last, T &cpp_properties) {

  bool success = cp::parse<T, Iterator, Traits>(first, last, cpp_properties);

  // print results
  if (!success) {
    std::string rest(first, last);
    std::cout << "Lexical analysis failed\n"
              << "stopped at: \"" << rest << "\"\n";
  }
}